

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testIsInfinite<Imath_2_5::Vec3<float>>(char *type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  float *pfVar5;
  char *in_RDI;
  Box<Imath_2_5::Vec3<float>_> b_1;
  Vec3<float> max;
  Vec3<float> min;
  Box<Imath_2_5::Vec3<float>_> b1;
  uint i;
  Vec3<float> p1;
  Vec3<float> p0;
  Box<Imath_2_5::Vec3<float>_> b0;
  Box<Imath_2_5::Vec3<float>_> b;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  Box<Imath_2_5::Vec3<float>_> *in_stack_ffffffffffffff50;
  Box<Imath_2_5::Vec3<float>_> *in_stack_ffffffffffffff58;
  Vec3<float> local_9c;
  Vec3<float> local_90 [3];
  uint local_6c;
  Vec3<float> local_68;
  Vec3<float> local_5c;
  Vec3<float> local_50;
  Vec3<float> local_44 [5];
  char *local_8;
  
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"    isInfinite() for type ");
  poVar4 = std::operator<<(poVar4,local_8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::Box
            ((Box<Imath_2_5::Vec3<float>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::makeInfinite(in_stack_ffffffffffffff50);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<float>_>::isInfinite(in_stack_ffffffffffffff58);
  if (!bVar1) {
    __assert_fail("b.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,799,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<float>]"
                 );
  }
  Imath_2_5::Vec3<float>::Vec3(local_44,-1.0);
  Imath_2_5::Vec3<float>::Vec3(&local_50,1.0);
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::Box
            (in_stack_ffffffffffffff50,
             (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<float>_>::isInfinite(in_stack_ffffffffffffff58);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b0.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x32a,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<float>]"
                 );
  }
  Imath_2_5::Vec3<float>::Vec3(&local_5c);
  Imath_2_5::Vec3<float>::Vec3(&local_68);
  local_6c = 0;
  while( true ) {
    uVar3 = local_6c;
    uVar2 = Imath_2_5::Vec3<float>::dimensions();
    if (uVar2 <= uVar3) break;
    in_stack_ffffffffffffff40 = -(float)(1 << ((char)local_6c + 1U & 0x1f));
    pfVar5 = Imath_2_5::Vec3<float>::operator[](&local_5c,local_6c);
    *pfVar5 = in_stack_ffffffffffffff40;
    uVar3 = Imath_2_5::Vec3<float>::dimensions();
    in_stack_ffffffffffffff44 = (float)(1 << ((char)uVar3 - (char)local_6c & 0x1fU));
    pfVar5 = Imath_2_5::Vec3<float>::operator[](&local_68,local_6c);
    *pfVar5 = in_stack_ffffffffffffff44;
    local_6c = local_6c + 1;
  }
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::Box
            (in_stack_ffffffffffffff50,(Vec3<float> *)CONCAT44(in_stack_ffffffffffffff4c,uVar3),
             (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<float>_>::isInfinite(in_stack_ffffffffffffff58);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b1.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x334,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<float>]"
                 );
  }
  Imath_2_5::Vec3<float>::Vec3(local_90,0.0);
  Imath_2_5::Vec3<float>::Vec3(&local_9c,local_90);
  uVar2 = Imath_2_5::Vec3<float>::dimensions();
  pfVar5 = Imath_2_5::Vec3<float>::operator[](&local_9c,uVar2 - 1);
  *pfVar5 = 2.0;
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::Box
            (in_stack_ffffffffffffff50,(Vec3<float> *)CONCAT44(in_stack_ffffffffffffff4c,uVar3),
             (Vec3<float> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec3<float>_>::isInfinite(in_stack_ffffffffffffff58);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!b.isInfinite()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testBox.cpp"
                  ,0x345,
                  "void (anonymous namespace)::testIsInfinite(const char *) [T = Imath_2_5::Vec3<float>]"
                 );
  }
  return;
}

Assistant:

void
testIsInfinite(const char *type)
{
    cout << "    isInfinite() for type " << type << endl;

    //
    // Infinite box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        b.makeInfinite();
        assert(b.isInfinite());
    }

    //
    // Non-empty, has-volume box.
    //    2D: [(-2, -4),         ( 8,  2)       ]
    //    3D: [(-2, -4, -6),     (12,  8, 2)    ]
    //    4D: [(-2, -4, -6, -8), (16, 12, 8, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0(T(-1), T(1));
        assert(!b0.isInfinite());

        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions(); i++)
        {
            p0[i] = -typename T::BaseType(1 << (i + 1));
            p1[i] =  typename T::BaseType(1 << (T::dimensions() - i));
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1(p0, p1);
        assert(!b1.isInfinite());
    }

    //
    // Non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 2)      ]
    //    3D: [(0, 0, 0),    (0, 0, 2)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 2)]
    //
    {
        T min(0);
        T max = min;
        max[T::dimensions() - 1] = 2;

        IMATH_INTERNAL_NAMESPACE::Box<T> b(min, max);

        assert(!b.isInfinite());
    }
}